

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::Cast_x86_avx2::forward(Cast_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int _d;
  int _elempack;
  _func_int *p_Var2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  uint uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  undefined1 (*pauVar13) [32];
  int iVar14;
  uint uVar15;
  undefined1 (*pauVar16) [16];
  size_t _elemsize;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar31 [32];
  m128i fp16;
  m256i mask;
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  undefined1 auVar30 [32];
  
  p_Var2 = this->_vptr_Cast_x86_avx2[-3];
  if (*(int *)(&this->field_0xd0 + (long)p_Var2) == *(int *)(&this->field_0xd4 + (long)p_Var2)) {
    iVar14 = 0;
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (*top_blob->allocator->_vptr_Allocator[3])();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
      *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar14 = bottom_blob->w;
      iVar10 = bottom_blob->h;
      iVar1 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar14;
      top_blob->h = iVar10;
      top_blob->d = iVar1;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      iVar14 = 0;
    }
  }
  else {
    iVar10 = bottom_blob->w;
    iVar1 = bottom_blob->h;
    _d = bottom_blob->d;
    uVar19 = bottom_blob->c;
    uVar11 = (ulong)uVar19;
    iVar14 = bottom_blob->dims;
    _elempack = bottom_blob->elempack;
    _elemsize = (size_t)_elempack;
    switch(*(int *)(&this->field_0xd4 + (long)p_Var2)) {
    case 1:
      if (*(int *)(&this->field_0xd0 + (long)p_Var2) == 3) {
        Cast::forward((Cast *)((long)&this->_vptr_Cast_x86_avx2 + (long)p_Var2),bottom_blob,top_blob
                      ,opt);
      }
      _elemsize = _elemsize * 4;
      break;
    case 2:
    case 4:
      _elemsize = (size_t)(_elempack * 2);
      break;
    case 3:
      break;
    default:
      _elemsize = bottom_blob->elemsize;
    }
    switch(iVar14) {
    case 1:
      Mat::create(top_blob,iVar10,_elemsize,_elempack,opt->blob_allocator);
      break;
    case 2:
      Mat::create(top_blob,iVar10,iVar1,_elemsize,_elempack,opt->blob_allocator);
      break;
    case 3:
      Mat::create(top_blob,iVar10,iVar1,uVar19,_elemsize,_elempack,opt->blob_allocator);
      break;
    case 4:
      Mat::create(top_blob,iVar10,iVar1,_d,uVar19,_elemsize,_elempack,opt->blob_allocator);
    }
    iVar14 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar7 = _d * _elempack * iVar1 * iVar10;
      iVar14 = (int)uVar7 >> 3;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx2[-3]) == 1) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx2[-3]) == 2)) {
        local_80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if ((uVar7 & 7) != 0) {
          lVar8 = (ulong)(uVar7 & 7) - 1;
          auVar22._8_8_ = 0x8000000000000000;
          auVar22._0_8_ = 0x8000000000000000;
          auVar22._16_8_ = 0x8000000000000000;
          auVar22._24_8_ = 0x8000000000000000;
          auVar20._8_8_ = lVar8;
          auVar20._0_8_ = lVar8;
          auVar20._16_8_ = lVar8;
          auVar20._24_8_ = lVar8;
          auVar21 = vpcmpgtq_avx2(_DAT_0031abc0,auVar20 ^ auVar22);
          auVar20 = vpcmpgtq_avx2(_DAT_0031abe0,auVar20 ^ auVar22);
          auVar20 = vpackssdw_avx2(auVar20,auVar21);
          auVar21 = vpcmpeqd_avx2(auVar21,auVar21);
          auVar26 = vpackssdw_avx(SUB3216(auVar20 ^ auVar21,0),SUB3216(auVar20 ^ auVar21,0x10));
          auVar26 = vpshufd_avx(auVar26,0xd8);
          auVar20 = vpmovzxwd_avx2(auVar26);
          auVar20 = vpslld_avx2(auVar20,0x1f);
          auVar21._8_4_ = 0x80000000;
          auVar21._0_8_ = 0x8000000080000000;
          auVar21._12_4_ = 0x80000000;
          auVar21._16_4_ = 0x80000000;
          auVar21._20_4_ = 0x80000000;
          auVar21._24_4_ = 0x80000000;
          auVar21._28_4_ = 0x80000000;
          local_80 = vpmaskmovd_avx2(auVar20,auVar21);
        }
        if (0 < (int)uVar19) {
          uVar18 = 0;
          do {
            pauVar9 = (undefined1 (*) [32])
                      (bottom_blob->cstep * uVar18 * bottom_blob->elemsize + (long)bottom_blob->data
                      );
            pauVar12 = (undefined1 (*) [16])
                       (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
            iVar10 = iVar14;
            if (0 < iVar14) {
              do {
                auVar26 = vcvtps2ph_f16c(*pauVar9,3);
                *pauVar12 = auVar26;
                pauVar9 = pauVar9 + 1;
                pauVar12 = pauVar12 + 1;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
            }
            if ((uVar7 & 7) != 0) {
              auVar20 = vmaskmovps_avx(local_80,*pauVar9);
              local_90 = vcvtps2ph_f16c(auVar20,3);
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
              memcpy(pauVar12,local_90,(ulong)((uVar7 & 7) * 2));
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar11);
        }
      }
      auVar26 = in_ZMM5._0_16_;
      auVar20 = in_ZMM3._0_32_;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx2[-3]) == 2) &&
         (*(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx2[-3]) == 1)) {
        local_80 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if ((uVar7 & 7) != 0) {
          lVar8 = (ulong)(uVar7 & 7) - 1;
          auVar28._8_8_ = 0x8000000000000000;
          auVar28._0_8_ = 0x8000000000000000;
          auVar28._16_8_ = 0x8000000000000000;
          auVar28._24_8_ = 0x8000000000000000;
          auVar27._8_8_ = lVar8;
          auVar27._0_8_ = lVar8;
          auVar27._16_8_ = lVar8;
          auVar27._24_8_ = lVar8;
          auVar22 = vpcmpgtq_avx2(_DAT_0031abc0,auVar27 ^ auVar28);
          auVar21 = vpcmpgtq_avx2(_DAT_0031abe0,auVar27 ^ auVar28);
          auVar21 = vpackssdw_avx2(auVar21,auVar22);
          auVar22 = vpcmpeqd_avx2(auVar22,auVar22);
          auVar25 = vpackssdw_avx(SUB3216(auVar21 ^ auVar22,0),SUB3216(auVar21 ^ auVar22,0x10));
          auVar25 = vpshufd_avx(auVar25,0xd8);
          auVar21 = vpmovzxwd_avx2(auVar25);
          auVar21 = vpslld_avx2(auVar21,0x1f);
          auVar23._8_4_ = 0x80000000;
          auVar23._0_8_ = 0x8000000080000000;
          auVar23._12_4_ = 0x80000000;
          auVar23._16_4_ = 0x80000000;
          auVar23._20_4_ = 0x80000000;
          auVar23._24_4_ = 0x80000000;
          auVar23._28_4_ = 0x80000000;
          local_80 = vpmaskmovd_avx2(auVar21,auVar23);
        }
        if (0 < (int)uVar19) {
          uVar18 = 0;
          do {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_blob->cstep * uVar18 * bottom_blob->elemsize +
                       (long)bottom_blob->data);
            pauVar9 = (undefined1 (*) [32])
                      (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
            iVar10 = iVar14;
            if (0 < iVar14) {
              do {
                auVar26 = vlddqu_avx(*pauVar12);
                auVar20 = vcvtph2ps_f16c(auVar26);
                *pauVar9 = auVar20;
                pauVar12 = pauVar12 + 1;
                pauVar9 = pauVar9 + 1;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
            }
            if ((uVar7 & 7) != 0) {
              local_90 = (undefined1  [16])0x0;
              in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
              in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
              memcpy(local_90,pauVar12,(ulong)((uVar7 & 7) * 2));
              auVar20 = vcvtph2ps_f16c(local_90);
              auVar20 = vmaskmovps_avx(local_80,auVar20);
              *pauVar9 = auVar20;
            }
            auVar26 = in_ZMM5._0_16_;
            auVar20 = in_ZMM3._0_32_;
            uVar18 = uVar18 + 1;
          } while (uVar18 != uVar11);
        }
      }
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx2[-3]) == 4) &&
         (0 < (int)uVar19 && *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx2[-3]) == 1)
         ) {
        uVar18 = 0;
        do {
          pauVar12 = (undefined1 (*) [16])
                     (bottom_blob->cstep * uVar18 * bottom_blob->elemsize + (long)bottom_blob->data)
          ;
          pauVar16 = (undefined1 (*) [16])
                     (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
          iVar10 = iVar14 + 1;
          if (0 < iVar14) {
            do {
              auVar25 = vlddqu_avx(*pauVar12);
              auVar29 = vpunpcklwd_avx((undefined1  [16])0x0,auVar25);
              auVar25 = vpunpckhwd_avx((undefined1  [16])0x0,auVar25);
              pauVar16[1] = auVar25;
              *pauVar16 = auVar29;
              pauVar12 = pauVar12 + 1;
              pauVar16 = pauVar16 + 2;
              iVar10 = iVar10 + -1;
            } while (1 < iVar10);
          }
          if ((uVar7 & 7) != 0) {
            lVar8 = 0;
            iVar10 = (uVar7 & 7) + 1;
            do {
              *(uint *)(*pauVar16 + lVar8 * 2) = (uint)*(ushort *)(*pauVar12 + lVar8) << 0x10;
              iVar10 = iVar10 + -1;
              lVar8 = lVar8 + 2;
            } while (1 < iVar10);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar11);
      }
      iVar14 = 0;
      if ((*(int *)(&this->field_0xd0 + (long)this->_vptr_Cast_x86_avx2[-3]) == 1) &&
         (iVar14 = 0,
         0 < (int)uVar19 && *(int *)(&this->field_0xd4 + (long)this->_vptr_Cast_x86_avx2[-3]) == 4))
      {
        uVar19 = uVar7 & 0xf;
        uVar18 = 0;
        auVar21 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar22 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar24._8_8_ = 0x8000000000000000;
        auVar24._0_8_ = 0x8000000000000000;
        auVar24._16_8_ = 0x8000000000000000;
        auVar24._24_8_ = 0x8000000000000000;
        auVar20 = vpcmpeqd_avx2(auVar20,auVar20);
        auVar25._8_8_ = 0x8000000000000000;
        auVar25._0_8_ = 0x8000000000000000;
        auVar26 = vpcmpeqd_avx(auVar26,auVar26);
        do {
          pauVar9 = (undefined1 (*) [32])
                    (bottom_blob->cstep * uVar18 * bottom_blob->elemsize + (long)bottom_blob->data);
          pauVar13 = (undefined1 (*) [32])
                     (top_blob->cstep * uVar18 * top_blob->elemsize + (long)top_blob->data);
          iVar14 = ((int)uVar7 >> 4) + 1;
          if (0 < (int)uVar7 >> 4) {
            do {
              auVar27 = vpsrld_avx2(*pauVar9,0x10);
              auVar28 = vpsrld_avx2(pauVar9[1],0x10);
              auVar27 = vpackusdw_avx2(auVar27,auVar28);
              auVar27 = vpermq_avx2(auVar27,0xd8);
              *pauVar13 = auVar27;
              pauVar9 = pauVar9 + 2;
              pauVar13 = pauVar13 + 1;
              iVar14 = iVar14 + -1;
            } while (1 < iVar14);
          }
          uVar15 = uVar19;
          if (7 < uVar19) {
            auVar27 = vpsrld_avx2(*pauVar9,0x10);
            auVar29 = vpackusdw_avx(auVar27._0_16_,auVar27._16_16_);
            *(undefined1 (*) [16])*pauVar13 = auVar29;
            pauVar9 = pauVar9 + 1;
            pauVar13 = (undefined1 (*) [32])(*pauVar13 + 0x10);
            uVar15 = uVar19 - 8;
          }
          if (0 < (int)uVar15) {
            lVar8 = (ulong)uVar15 - 1;
            auVar29._8_8_ = lVar8;
            auVar29._0_8_ = lVar8;
            auVar30._16_8_ = lVar8;
            auVar30._0_16_ = auVar29;
            auVar30._24_8_ = lVar8;
            uVar17 = 0;
            do {
              auVar31._8_8_ = uVar17;
              auVar31._0_8_ = uVar17;
              auVar31._16_8_ = uVar17;
              auVar31._24_8_ = uVar17;
              auVar6 = vpor_avx2(auVar31,auVar21);
              auVar31 = vpor_avx2(auVar31,auVar22);
              auVar28 = vpcmpgtq_avx2(auVar31 ^ auVar24,auVar30 ^ auVar24);
              auVar23 = vpcmpgtq_avx2(auVar6 ^ auVar24,auVar30 ^ auVar24);
              auVar27 = vpackssdw_avx2(auVar23,auVar28);
              auVar4 = vpackssdw_avx(SUB3216(auVar27 ^ auVar20,0),SUB3216(auVar27 ^ auVar20,0x10));
              auVar5 = vpshufd_avx(auVar4,0xd8);
              auVar27 = vpmovzxwd_avx2(auVar5);
              auVar27 = vpslld_avx2(auVar27,0x1f);
              auVar27 = vpmaskmovd_avx2(auVar27,*(undefined1 (*) [32])(*pauVar9 + uVar17 * 4));
              if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar13 + uVar17 * 2) = auVar27._2_2_;
              }
              auVar4 = vpcmpgtq_avx(auVar6._0_16_ ^ auVar25,auVar29 ^ auVar25);
              auVar4 = vpackssdw_avx(auVar4,auVar4);
              auVar4 = vpackssdw_avx(auVar4 ^ auVar26,auVar4 ^ auVar26);
              if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar13 + uVar17 * 2 + 2) = auVar27._6_2_;
              }
              auVar6 = vpackssdw_avx2(auVar23,auVar21);
              auVar4 = auVar6._16_16_ ^ auVar26;
              auVar4 = vpackssdw_avx(auVar4,auVar4);
              if ((auVar4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar13 + uVar17 * 2 + 4) = auVar27._10_2_;
              }
              auVar23 = vpackssdw_avx2(auVar23,auVar21);
              auVar4 = auVar23._16_16_ ^ auVar26;
              auVar4 = vpackssdw_avx(auVar4,auVar4);
              if ((auVar4 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar13 + uVar17 * 2 + 6) = auVar27._14_2_;
              }
              auVar4 = vpcmpgtq_avx(auVar31._0_16_ ^ auVar25,auVar29 ^ auVar25);
              auVar4 = vpackssdw_avx(auVar4,auVar4);
              auVar4 = vpackssdw_avx(auVar4 ^ auVar26,auVar4 ^ auVar26);
              if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar13 + uVar17 * 2 + 8) = auVar27._18_2_;
              }
              auVar4 = vpcmpgtq_avx(auVar31._0_16_ ^ auVar25,auVar29 ^ auVar25);
              auVar4 = vpackssdw_avx(auVar4,auVar4);
              auVar4 = vpackssdw_avx(auVar4 ^ auVar26,auVar4 ^ auVar26);
              if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar13 + uVar17 * 2 + 10) = auVar27._22_2_;
              }
              auVar23 = vpackssdw_avx2(auVar21,auVar28);
              auVar4 = auVar23._16_16_ ^ auVar26;
              auVar4 = vpackssdw_avx(auVar4,auVar4);
              if ((auVar4 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar13 + uVar17 * 2 + 0xc) = auVar27._26_2_;
              }
              auVar28 = vpshufhw_avx2(auVar28,0x84);
              auVar4 = auVar28._16_16_ ^ auVar26;
              auVar4 = vpackssdw_avx(auVar4,auVar4);
              if ((auVar4 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(short *)(*pauVar13 + uVar17 * 2 + 0xe) = auVar27._30_2_;
              }
              uVar17 = uVar17 + 8;
            } while ((uVar15 + 7 & 0xfffffff8) != uVar17);
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar11);
        iVar14 = 0;
      }
    }
  }
  return iVar14;
}

Assistant:

int Cast_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if __AVX2__
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        if (type_from == 3)
        {
            Cast::forward(bottom_blob, top_blob, opt);
        }

        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;
    if (type_from == 1 && type_to == 2)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = {_mm256_setzero_si256()};
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m256 fp32 = _mm256_loadu_ps(ptr);
                __m128i fp16 = _mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC);
                _mm_store_si128((__m128i*)outptr, fp16);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                __m256 fp32 = _mm256_maskload_ps(ptr, mask.vec);
                m128i fp16 = {_mm256_cvtps_ph(fp32, _MM_FROUND_TRUNC)};
                memcpy(outptr, fp16.m128i_u16, remain * sizeof(unsigned short));
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        int nn = size >> 3;
        int remain = size - (nn << 3);
        m256i mask = {_mm256_setzero_si256()};
        for (int i = 0; i < remain; i++)
            mask.m256i_u32[i] = 0x80000000;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < nn; i++)
            {
                __m128i fp16 = _mm_lddqu_si128((__m128i const*)ptr);
                __m256 fp32 = _mm256_cvtph_ps(fp16);
                _mm256_storeu_ps(outptr, fp32);
                ptr += 8;
                outptr += 8;
            }

            if (remain > 0)
            {
                m128i fp16 = {_mm_setzero_si128()};
                memcpy(fp16.m128i_u16, ptr, remain * sizeof(unsigned short));
                __m256 fp32 = _mm256_cvtph_ps(fp16.vec);
                _mm256_maskstore_ps(outptr, mask.vec, fp32);
            }
        }
    }
    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            int nn = size >> 3;
            int remain = size & 7;
            for (; nn > 0; nn--)
            {
                _mm256_storeu_ps(outptr, bfloat2float_avx(_mm_lddqu_si128((__m128i const*)ptr)));
                ptr += 8;
                outptr += 8;
            }

            for (; remain > 0; remain--)
            {
                *outptr = bfloat16_to_float32(*ptr);
                outptr++;
                ptr++;
            }
        }
    }
    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);
            int nn = size >> 4;
            int remain = size & 15;
            for (; nn > 0; nn--)
            {
                _mm256_storeu_si256((__m256i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr), _mm256_loadu_ps(ptr + 8)));
                ptr += 16;
                outptr += 16;
            }
            if (remain >= 8)
            {
                remain -= 8;
                _mm_store_si128((__m128i*)outptr, float2bfloat_avx(_mm256_loadu_ps(ptr)));
                ptr += 8;
                outptr += 8;
            }
            for (; remain > 0; remain--)
            {
                *outptr = float32_to_bfloat16(*ptr);
                outptr++;
                ptr++;
            }
        }
    }

    return 0;
#else // __AVX__

    return Cast::forward(bottom_blob, top_blob, opt);

#endif // __AVX__
}